

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_globaltype_t * wasm_globaltype_new(wasm_valtype_t *type,wasm_mutability_t mut)

{
  wasm_globaltype_t *this;
  GlobalType local_30;
  
  if (type != (wasm_valtype_t *)0x0) {
    this = (wasm_globaltype_t *)operator_new(0x18);
    local_30.super_ExternType._12_4_ = (type->I).enum_;
    local_30.super_ExternType.kind = Global;
    local_30.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001f0960;
    local_30.mut = (Mutability)(mut != '\0');
    wasm_globaltype_t::wasm_globaltype_t(this,&local_30);
    wasm_valtype_delete(type);
    return this;
  }
  __assert_fail("type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,0x335,"wasm_globaltype_t *wasm_globaltype_new(wasm_valtype_t *, wasm_mutability_t)"
               );
}

Assistant:

own wasm_globaltype_t* wasm_globaltype_new(own wasm_valtype_t* type,
                                           wasm_mutability_t mut) {
  assert(type);
  auto* result = new wasm_globaltype_t{GlobalType{
      type->I, mut == WASM_CONST ? Mutability::Const : Mutability::Var}};
  wasm_valtype_delete(type);
  return result;
}